

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_register_device_collection_changed
              (cubeb_conflict *context,cubeb_device_type devtype,
              cubeb_device_collection_changed_callback_conflict collection_changed_callback,
              void *user_ptr)

{
  int iVar1;
  
  if ((devtype & CUBEB_DEVICE_TYPE_INPUT) != CUBEB_DEVICE_TYPE_UNKNOWN) {
    context->input_collection_changed_callback = collection_changed_callback;
    context->input_collection_changed_user_ptr = user_ptr;
  }
  if ((devtype & CUBEB_DEVICE_TYPE_OUTPUT) == CUBEB_DEVICE_TYPE_UNKNOWN) {
    collection_changed_callback = context->output_collection_changed_callback;
  }
  else {
    context->output_collection_changed_callback = collection_changed_callback;
    context->output_collection_changed_user_ptr = user_ptr;
  }
  iVar1 = pulse_subscribe_notifications
                    (context,(uint)(collection_changed_callback !=
                                   (cubeb_device_collection_changed_callback_conflict)0x0) +
                             (uint)(context->input_collection_changed_callback !=
                                   (cubeb_device_collection_changed_callback_conflict)0x0) * 2 +
                             PA_SUBSCRIPTION_MASK_SERVER);
  return iVar1;
}

Assistant:

static int
pulse_register_device_collection_changed(
    cubeb * context, cubeb_device_type devtype,
    cubeb_device_collection_changed_callback collection_changed_callback,
    void * user_ptr)
{
  if (devtype & CUBEB_DEVICE_TYPE_INPUT) {
    context->input_collection_changed_callback = collection_changed_callback;
    context->input_collection_changed_user_ptr = user_ptr;
  }
  if (devtype & CUBEB_DEVICE_TYPE_OUTPUT) {
    context->output_collection_changed_callback = collection_changed_callback;
    context->output_collection_changed_user_ptr = user_ptr;
  }

  pa_subscription_mask_t mask = PA_SUBSCRIPTION_MASK_NULL;
  if (context->input_collection_changed_callback) {
    /* Input added or removed */
    mask |= PA_SUBSCRIPTION_MASK_SOURCE;
  }
  if (context->output_collection_changed_callback) {
    /* Output added or removed */
    mask |= PA_SUBSCRIPTION_MASK_SINK;
  }
  /* Default device changed, this is always registered in order to update the
   * `default_sink_info` when the default device changes. */
  mask |= PA_SUBSCRIPTION_MASK_SERVER;

  return pulse_subscribe_notifications(context, mask);
}